

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void parse_uninstall(void)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  long lVar5;
  pointer pbVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_2d2;
  allocator_type local_2d1;
  string line;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  fstream fin;
  string local_220 [496];
  
  bVar2 = Args::has_help(&args,true,true,true);
  if (bVar2) {
    help_uninstall();
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&fin,"-r",(allocator<char> *)&file);
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,"--requirement",(allocator<char> *)&line);
  __l._M_len = 2;
  __l._M_array = (iterator)&fin;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,__l,&local_2d2);
  bVar2 = Args::has_option(&args,&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&fin + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&fin,"-r",(allocator<char> *)&line)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              (local_220,"--requirement",(allocator<char> *)&local_2d2);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&fin;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_290,__l_00,&local_2d1);
    Args::get_option_value(&file,&args,&local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
    lVar5 = 0x20;
    do {
      std::__cxx11::string::~string((string *)(&fin + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    std::fstream::fstream(&fin,(string *)&file,_S_in);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      poVar4 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._52_4_);
      poVar4 = std::operator<<(poVar4,"ERROR: Could not open requirements file: ");
      poVar4 = std::operator<<(poVar4,(string *)&file);
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    while (((byte)local_220[*(long *)(_fin + -0x18)] & 2) == 0) {
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      line._M_dataplus._M_p = (pointer)&line.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&fin,(string *)&line);
      if (line._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args.packages,&line);
      }
      std::__cxx11::string::~string((string *)&line);
    }
    std::fstream::close();
    std::fstream::~fstream(&fin);
    std::__cxx11::string::~string((string *)&file);
  }
  pbVar1 = args.packages.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = args.packages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::string((string *)&local_260,(string *)pbVar6);
    Downloader::Uninstall((Downloader *)&fin,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
  }
  return;
}

Assistant:

void parse_uninstall(){
    if(args.has_help()){
        help_uninstall();
    }else{
        if(args.has_option({"-r","--requirement"})){
            std::string file=args.get_option_value({"-r","--requirement"});
            std::fstream fin(file,std::ios::in);
            if(fin.is_open()==false){
                std::cout << ispring::xout.red << "ERROR: Could not open requirements file: " << file << std::endl;
                exit(1);
            }
            while(!fin.eof()){
                std::string line;
                std::getline(fin,line);
                if(line.empty())continue;
                args.packages.push_back(line);
            }
            fin.close();
        }
        for(auto&p:args.packages){
            Downloader loader;
            loader.Uninstall(p);
        }
    }
}